

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_ManReadSignalList(Prs_Man_t *p,Vec_Int_t *vTemp,char LastSymb,int fAddForm)

{
  int iVar1;
  int Item;
  int fAddForm_local;
  char LastSymb_local;
  Vec_Int_t *vTemp_local;
  Prs_Man_t *p_local;
  
  Vec_IntClear(vTemp);
  while( true ) {
    iVar1 = Prs_ManReadSignal(p);
    if (iVar1 == 0) {
      iVar1 = Prs_ManErrorSet(p,"Cannot read signal in the list.",0);
      return iVar1;
    }
    if (fAddForm != 0) {
      Vec_IntPush(vTemp,0);
    }
    Vec_IntPush(vTemp,iVar1);
    iVar1 = Prs_ManIsChar(p,LastSymb);
    if (iVar1 != 0) break;
    iVar1 = Prs_ManIsChar(p,',');
    if (iVar1 == 0) {
      iVar1 = Prs_ManErrorSet(p,"Expecting comma in the list.",0);
      return iVar1;
    }
    p->pCur = p->pCur + 1;
  }
  return 1;
}

Assistant:

int Prs_ManReadSignalList( Prs_Man_t * p, Vec_Int_t * vTemp, char LastSymb, int fAddForm )
{
    Vec_IntClear( vTemp );
    while ( 1 )
    {
        int Item = Prs_ManReadSignal(p);
        if ( Item == 0 )                    return Prs_ManErrorSet(p, "Cannot read signal in the list.", 0);
        if ( fAddForm )
            Vec_IntPush( vTemp, 0 );
        Vec_IntPush( vTemp, Item );
        if ( Prs_ManIsChar(p, LastSymb) )   break;
        if ( !Prs_ManIsChar(p, ',') )       return Prs_ManErrorSet(p, "Expecting comma in the list.", 0);
        p->pCur++;
    }
    return 1;
}